

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_encode(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  opj_tcd *poVar1;
  opj_tcd_tilecomp_t *poVar2;
  opj_image_t *poVar3;
  opj_image_comp_t *poVar4;
  bool bVar5;
  OPJ_BOOL OVar6;
  int iVar7;
  int iVar8;
  OPJ_INT32 OVar9;
  OPJ_INT32 OVar10;
  OPJ_INT32 OVar11;
  OPJ_SIZE_T new_size;
  OPJ_BYTE *p_src;
  ulong uVar12;
  uint uVar13;
  opj_tcd *p_manager_00;
  long lVar14;
  OPJ_UINT32 p_tile_index;
  opj_tcd *poVar15;
  OPJ_BYTE *pOVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  ulong local_68;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2bea,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2beb,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2bec,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  poVar1 = p_j2k->m_tcd;
  uVar13 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
  p_manager_00 = (opj_tcd *)(ulong)uVar13;
  bVar5 = true;
  if (uVar13 == 1) {
    p_manager_00 = (opj_tcd *)((ulong)poVar1->image->numcomps << 6);
    bVar5 = true;
    for (poVar15 = (opj_tcd *)0x0; p_manager_00 != poVar15;
        poVar15 = (opj_tcd *)&poVar15->thread_pool) {
      if ((*(byte *)((long)&poVar1->image->comps->data + (long)poVar15) & 0xf) != 0) {
        bVar5 = false;
      }
    }
    bVar5 = !bVar5;
  }
  local_68 = 0;
  p_tile_index = 0;
  pOVar16 = (OPJ_BYTE *)0x0;
  do {
    OVar6 = 1;
    p_src = pOVar16;
    if (p_tile_index == uVar13) goto LAB_00112955;
    OVar6 = opj_j2k_pre_write_tile
                      (p_j2k,p_tile_index,(opj_stream_private_t *)p_manager,
                       (opj_event_mgr_t *)p_manager_00);
    if (OVar6 == 0) break;
    lVar14 = 0x30;
    lVar18 = 0;
    for (uVar19 = 0; uVar19 < p_j2k->m_tcd->image->numcomps; uVar19 = uVar19 + 1) {
      poVar2 = poVar1->tcd_image->tiles->comps;
      if (bVar5) {
        OVar6 = opj_alloc_tile_component_data((opj_tcd_tilecomp_t *)((long)&poVar2->x0 + lVar18));
        if (OVar6 == 0) {
          OVar6 = 0;
          opj_event_msg(p_manager,1,"Error allocating tile component data.");
          goto LAB_00112955;
        }
      }
      else {
        *(undefined8 *)((long)&poVar2->data + lVar18) =
             *(undefined8 *)((long)&poVar1->image->comps->dx + lVar14);
        *(undefined4 *)((long)&poVar2->ownsData + lVar18) = 0;
      }
      lVar18 = lVar18 + 0x70;
      lVar14 = lVar14 + 0x40;
    }
    p_manager_00 = poVar1;
    new_size = opj_tcd_get_encoded_tile_size(p_j2k->m_tcd);
    if (bVar5) {
      if (local_68 < new_size) {
        p_src = (OPJ_BYTE *)opj_realloc(pOVar16,new_size);
        local_68 = new_size;
        if (p_src == (OPJ_BYTE *)0x0) {
          if (pOVar16 != (OPJ_BYTE *)0x0) {
            opj_free(pOVar16);
          }
          opj_event_msg(p_manager,1,"Not enough memory to encode all tiles\n");
          return 0;
        }
      }
      else if (pOVar16 == (OPJ_BYTE *)0x0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                      ,0x2c29,
                      "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                     );
      }
      poVar15 = p_j2k->m_tcd;
      pOVar16 = p_src;
      for (uVar19 = 0; poVar3 = poVar15->image, uVar19 < poVar3->numcomps; uVar19 = uVar19 + 1) {
        poVar2 = poVar15->tcd_image->tiles->comps;
        poVar4 = poVar3->comps;
        iVar17 = ((poVar4[uVar19].prec >> 3) + 1) - (uint)((poVar4[uVar19].prec & 7) == 0);
        if (iVar17 == 3) {
          iVar17 = 4;
        }
        iVar7 = poVar2[uVar19].x1 - poVar2[uVar19].x0;
        iVar8 = poVar2[uVar19].y1 - poVar2[uVar19].y0;
        OVar9 = opj_int_ceildiv(poVar3->x0,poVar4[uVar19].dx);
        OVar10 = opj_int_ceildiv(poVar3->y0,poVar4[uVar19].dy);
        OVar11 = opj_int_ceildiv(poVar3->x1 - poVar3->x0,poVar4[uVar19].dx);
        p_manager_00 = (opj_tcd *)
                       (poVar4[uVar19].data +
                       (uint)((poVar2[uVar19].y0 - OVar10) * OVar11 + (poVar2[uVar19].x0 - OVar9)));
        uVar12 = (ulong)(uint)(OVar11 - iVar7);
        if (iVar17 == 1) {
          if (poVar4[uVar19].sgnd == 0) {
            for (iVar17 = 0; iVar17 != iVar8; iVar17 = iVar17 + 1) {
              lVar14 = uVar12 * -4;
              for (lVar18 = 0; iVar7 != (int)lVar18; lVar18 = lVar18 + 1) {
                pOVar16[lVar18] = *(OPJ_BYTE *)((long)&p_manager_00->tp_pos + lVar18 * 4);
                lVar14 = lVar14 + -4;
              }
              p_manager_00 = (opj_tcd *)((long)p_manager_00 - lVar14);
              pOVar16 = pOVar16 + lVar18;
            }
          }
          else {
            for (iVar17 = 0; iVar17 != iVar8; iVar17 = iVar17 + 1) {
              lVar14 = uVar12 * -4;
              for (lVar18 = 0; iVar7 != (int)lVar18; lVar18 = lVar18 + 1) {
                pOVar16[lVar18] = *(OPJ_BYTE *)((long)&p_manager_00->tp_pos + lVar18 * 4);
                lVar14 = lVar14 + -4;
              }
              p_manager_00 = (opj_tcd *)((long)p_manager_00 - lVar14);
              pOVar16 = pOVar16 + lVar18;
            }
          }
        }
        else if (iVar17 == 2) {
          if (poVar4[uVar19].sgnd == 0) {
            for (iVar17 = 0; iVar17 != iVar8; iVar17 = iVar17 + 1) {
              lVar14 = uVar12 * -4;
              for (lVar18 = 0; iVar7 != (int)lVar18; lVar18 = lVar18 + 1) {
                *(undefined2 *)pOVar16 = *(undefined2 *)((long)&p_manager_00->tp_pos + lVar18 * 4);
                pOVar16 = pOVar16 + 2;
                lVar14 = lVar14 + -4;
              }
              p_manager_00 = (opj_tcd *)((long)p_manager_00 - lVar14);
            }
          }
          else {
            for (iVar17 = 0; iVar17 != iVar8; iVar17 = iVar17 + 1) {
              lVar14 = uVar12 * -4;
              for (lVar18 = 0; iVar7 != (int)lVar18; lVar18 = lVar18 + 1) {
                *(undefined2 *)pOVar16 = *(undefined2 *)((long)&p_manager_00->tp_pos + lVar18 * 4);
                pOVar16 = pOVar16 + 2;
                lVar14 = lVar14 + -4;
              }
              p_manager_00 = (opj_tcd *)((long)p_manager_00 - lVar14);
            }
          }
        }
        else if (iVar17 == 4) {
          for (iVar17 = 0; iVar17 != iVar8; iVar17 = iVar17 + 1) {
            lVar14 = 0;
            for (lVar18 = 0; iVar7 != (int)lVar18; lVar18 = lVar18 + 1) {
              *(undefined4 *)(pOVar16 + lVar18 * 4) =
                   *(undefined4 *)((long)&p_manager_00->tp_pos + lVar18 * 4);
              lVar14 = lVar14 + -4;
            }
            p_manager_00 = (opj_tcd *)((long)p_manager_00 + (uVar12 * 4 - lVar14));
            pOVar16 = pOVar16 + -lVar14;
          }
        }
      }
      OVar6 = opj_tcd_copy_tile_data(p_j2k->m_tcd,p_src,new_size);
      if (OVar6 == 0) {
        OVar6 = 0;
        opj_event_msg(p_manager,1,"Size mismatch between tile data and sent data.");
        goto LAB_0011295a;
      }
    }
    OVar6 = opj_j2k_post_write_tile(p_j2k,p_stream,p_manager);
    p_tile_index = p_tile_index + 1;
    pOVar16 = p_src;
  } while (OVar6 != 0);
  OVar6 = 0;
LAB_00112955:
  if (p_src != (OPJ_BYTE *)0x0) {
LAB_0011295a:
    opj_free(p_src);
  }
  return OVar6;
}

Assistant:

OPJ_BOOL opj_j2k_encode(opj_j2k_t * p_j2k,
                        opj_stream_private_t *p_stream,
                        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i, j;
    OPJ_UINT32 l_nb_tiles;
    OPJ_SIZE_T l_max_tile_size = 0, l_current_tile_size;
    OPJ_BYTE * l_current_data = 00;
    OPJ_BOOL l_reuse_data = OPJ_FALSE;
    opj_tcd_t* p_tcd = 00;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    p_tcd = p_j2k->m_tcd;

    l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;
    if (l_nb_tiles == 1) {
        l_reuse_data = OPJ_TRUE;
#ifdef __SSE__
        for (j = 0; j < p_j2k->m_tcd->image->numcomps; ++j) {
            opj_image_comp_t * l_img_comp = p_tcd->image->comps + j;
            if (((size_t)l_img_comp->data & 0xFU) !=
                    0U) { /* tile data shall be aligned on 16 bytes */
                l_reuse_data = OPJ_FALSE;
            }
        }
#endif
    }
    for (i = 0; i < l_nb_tiles; ++i) {
        if (! opj_j2k_pre_write_tile(p_j2k, i, p_stream, p_manager)) {
            if (l_current_data) {
                opj_free(l_current_data);
            }
            return OPJ_FALSE;
        }

        /* if we only have one tile, then simply set tile component data equal to image component data */
        /* otherwise, allocate the data */
        for (j = 0; j < p_j2k->m_tcd->image->numcomps; ++j) {
            opj_tcd_tilecomp_t* l_tilec = p_tcd->tcd_image->tiles->comps + j;
            if (l_reuse_data) {
                opj_image_comp_t * l_img_comp = p_tcd->image->comps + j;
                l_tilec->data  =  l_img_comp->data;
                l_tilec->ownsData = OPJ_FALSE;
            } else {
                if (! opj_alloc_tile_component_data(l_tilec)) {
                    opj_event_msg(p_manager, EVT_ERROR, "Error allocating tile component data.");
                    if (l_current_data) {
                        opj_free(l_current_data);
                    }
                    return OPJ_FALSE;
                }
            }
        }
        l_current_tile_size = opj_tcd_get_encoded_tile_size(p_j2k->m_tcd);
        if (!l_reuse_data) {
            if (l_current_tile_size > l_max_tile_size) {
                OPJ_BYTE *l_new_current_data = (OPJ_BYTE *) opj_realloc(l_current_data,
                                               l_current_tile_size);
                if (! l_new_current_data) {
                    if (l_current_data) {
                        opj_free(l_current_data);
                    }
                    opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to encode all tiles\n");
                    return OPJ_FALSE;
                }
                l_current_data = l_new_current_data;
                l_max_tile_size = l_current_tile_size;
            }
            if (l_current_data == NULL) {
                /* Should not happen in practice, but will avoid Coverity to */
                /* complain about a null pointer dereference */
                assert(0);
                return OPJ_FALSE;
            }

            /* copy image data (32 bit) to l_current_data as contiguous, all-component, zero offset buffer */
            /* 32 bit components @ 8 bit precision get converted to 8 bit */
            /* 32 bit components @ 16 bit precision get converted to 16 bit */
            opj_j2k_get_tile_data(p_j2k->m_tcd, l_current_data);

            /* now copy this data into the tile component */
            if (! opj_tcd_copy_tile_data(p_j2k->m_tcd, l_current_data,
                                         l_current_tile_size)) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size mismatch between tile data and sent data.");
                opj_free(l_current_data);
                return OPJ_FALSE;
            }
        }

        if (! opj_j2k_post_write_tile(p_j2k, p_stream, p_manager)) {
            if (l_current_data) {
                opj_free(l_current_data);
            }
            return OPJ_FALSE;
        }
    }

    if (l_current_data) {
        opj_free(l_current_data);
    }
    return OPJ_TRUE;
}